

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O0

void __thiscall foxxll::linuxaio_queue::post_requests(linuxaio_queue *this)

{
  uint uVar1;
  aio_context_t aVar2;
  bool bVar3;
  __pid_t _Var4;
  value_type vVar5;
  reference pvVar6;
  linuxaio_request *plVar7;
  reference this_00;
  request *prVar8;
  iocb *piVar9;
  reference ppiVar10;
  size_type sVar11;
  iterator ppiVar12;
  long lVar13;
  int *piVar14;
  ostream *poVar15;
  char *pcVar16;
  io_error *piVar17;
  iterator pvVar18;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  __sighandler_t __handler_01;
  int iVar19;
  mutex *__m;
  linuxaio_request *local_460;
  string local_3f8;
  ostringstream local_3d8 [8];
  ostringstream msg_1;
  long num_events;
  string local_250;
  ostringstream local_230 [8];
  ostringstream msg;
  long success;
  size_t cb_done;
  linuxaio_request *ar;
  size_t i;
  undefined1 local_90 [8];
  simple_vector<iocb_*> cbs;
  request_ptr req_1;
  request_ptr req;
  vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  reqs;
  undefined1 local_50 [8];
  unique_lock<std::mutex> lock;
  size_type sStack_28;
  int num_currently_waiting_requests;
  undefined1 local_20 [8];
  simple_vector<io_event> events;
  linuxaio_queue *this_local;
  
  sStack_28 = (size_type)this->max_events_;
  events.array_ = (value_type *)this;
  tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::SimpleVector
            ((SimpleVector<io_event,_(tlx::SimpleVectorMode)0> *)local_20,&stack0xffffffffffffffd8);
  do {
    _Var4 = tlx::Semaphore::wait(&this->num_waiting_requests_,(void *)0x1);
    vVar5 = shared_state<foxxll::request_queue_impl_worker::thread_state>::operator()
                      (&this->post_thread_state_);
    if ((vVar5 == TERMINATING) && (_Var4 == 0)) {
      tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::~SimpleVector
                ((SimpleVector<io_event,_(tlx::SimpleVectorMode)0> *)local_20);
      return;
    }
    __m = &this->waiting_mtx_;
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_50,__m);
    iVar19 = (int)__m;
    bVar3 = std::__cxx11::
            list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
            ::empty(&this->waiting_requests_);
    if (bVar3) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_50);
      tlx::Semaphore::signal(&this->num_waiting_requests_,iVar19,__handler);
    }
    else {
      std::
      vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::vector((vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                *)&req);
      pvVar6 = std::__cxx11::
               list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
               ::front(&this->waiting_requests_);
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::CountingPtr(&req_1,pvVar6);
      std::__cxx11::
      list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::pop_front(&this->waiting_requests_);
      std::
      vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
      ::emplace_back<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>
                ((vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
                  *)&req,&req_1);
      while( true ) {
        bVar3 = std::__cxx11::
                list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                ::empty(&this->waiting_requests_);
        if ((((bVar3 ^ 0xffU) & 1) == 0) ||
           (bVar3 = tlx::Semaphore::try_acquire(&this->num_free_events_,1,1), !bVar3))
        goto LAB_001ab564;
        iVar19 = 1;
        bVar3 = tlx::Semaphore::try_acquire(&this->num_waiting_requests_,1,0);
        if (!bVar3) break;
        pvVar6 = std::__cxx11::
                 list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                 ::front(&this->waiting_requests_);
        tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::CountingPtr
                  ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)&cbs.array_,
                   pvVar6);
        std::__cxx11::
        list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
        ::pop_front(&this->waiting_requests_);
        std::
        vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
        ::emplace_back<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>
                  ((vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
                    *)&req,(CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                           &cbs.array_);
        tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr
                  ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)&cbs.array_);
      }
      tlx::Semaphore::signal(&this->num_free_events_,iVar19,__handler_00);
LAB_001ab564:
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_50);
      tlx::Semaphore::wait(&this->num_free_events_,(void *)0x1);
      i = std::
          vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
          ::size((vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                  *)&req);
      tlx::SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0>::SimpleVector
                ((SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0> *)local_90,&i);
      for (ar = (linuxaio_request *)0x0;
          plVar7 = (linuxaio_request *)
                   std::
                   vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                   ::size((vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                           *)&req), ar < plVar7;
          ar = (linuxaio_request *)
               &(ar->super_request_with_state).super_request_with_waiters.super_request.field_0x1) {
        this_00 = std::
                  vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                  ::operator[]((vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                *)&req,(size_type)ar);
        prVar8 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::get(this_00);
        if (prVar8 == (request *)0x0) {
          local_460 = (linuxaio_request *)0x0;
        }
        else {
          local_460 = (linuxaio_request *)
                      __dynamic_cast(prVar8,&request::typeinfo,&linuxaio_request::typeinfo,0);
        }
        piVar9 = linuxaio_request::fill_control_block(local_460);
        ppiVar10 = tlx::SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0>::operator[]
                             ((SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0> *)local_90,
                              (size_type)ar);
        *ppiVar10 = piVar9;
      }
      std::
      vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::clear((vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
               *)&req);
      success = 0;
      while (sVar11 = tlx::SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0>::size
                                ((SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0> *)local_90),
            (ulong)success < sVar11) {
        aVar2 = this->context_;
        sVar11 = tlx::SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0>::size
                           ((SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0> *)local_90);
        ppiVar12 = tlx::SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0>::data
                             ((SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0> *)local_90);
        lVar13 = syscall(0xd1,aVar2,sVar11 - success,ppiVar12 + success);
        __handler_01 = extraout_RDX;
        if ((lVar13 < 1) &&
           (piVar14 = __errno_location(), __handler_01 = extraout_RDX_00, *piVar14 != 0xb)) {
          std::__cxx11::ostringstream::ostringstream(local_230);
          poVar15 = std::operator<<((ostream *)local_230,"Error in ");
          poVar15 = std::operator<<(poVar15,"void foxxll::linuxaio_queue::post_requests()");
          poVar15 = std::operator<<(poVar15," : ");
          poVar15 = std::operator<<(poVar15,"linuxaio_request::post io_submit()");
          poVar15 = std::operator<<(poVar15," : ");
          piVar14 = __errno_location();
          pcVar16 = strerror(*piVar14);
          std::operator<<(poVar15,pcVar16);
          piVar17 = (io_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::ostringstream::str();
          io_error::io_error(piVar17,&local_250);
          __cxa_throw(piVar17,&io_error::typeinfo,io_error::~io_error);
        }
        if (0 < lVar13) {
          tlx::Semaphore::signal(&this->num_posted_requests_,(int)lVar13,__handler_01);
          success = lVar13 + success;
          sVar11 = tlx::SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0>::size
                             ((SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0> *)local_90);
          if (success == sVar11) break;
        }
        aVar2 = this->context_;
        uVar1 = this->max_events_;
        pvVar18 = tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::data
                            ((SimpleVector<io_event,_(tlx::SimpleVectorMode)0> *)local_20);
        lVar13 = syscall(0xd0,aVar2,0,(ulong)uVar1,pvVar18,0);
        if (lVar13 < 0) {
          std::__cxx11::ostringstream::ostringstream(local_3d8);
          poVar15 = std::operator<<((ostream *)local_3d8,"Error in ");
          poVar15 = std::operator<<(poVar15,"void foxxll::linuxaio_queue::post_requests()");
          poVar15 = std::operator<<(poVar15," : ");
          poVar15 = std::operator<<(poVar15,
                                    "linuxaio_queue::post_requests io_getevents() nr_events=");
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,lVar13);
          poVar15 = std::operator<<(poVar15," : ");
          piVar14 = __errno_location();
          pcVar16 = strerror(*piVar14);
          std::operator<<(poVar15,pcVar16);
          piVar17 = (io_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::ostringstream::str();
          io_error::io_error(piVar17,&local_3f8);
          __cxa_throw(piVar17,&io_error::typeinfo,io_error::~io_error);
        }
        if (0 < lVar13) {
          pvVar18 = tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::data
                              ((SimpleVector<io_event,_(tlx::SimpleVectorMode)0> *)local_20);
          handle_events(this,pvVar18,lVar13,false);
        }
      }
      tlx::SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0>::~SimpleVector
                ((SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0> *)local_90);
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr(&req_1);
      std::
      vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::~vector((vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                 *)&req);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
  } while( true );
}

Assistant:

void linuxaio_queue::post_requests()
{
    tlx::simple_vector<io_event> events(max_events_);

    for ( ; ; ) // as long as thread is running
    {
        // block until next request or message comes in
        int num_currently_waiting_requests = num_waiting_requests_.wait();

        // terminate if termination has been requested
        if (post_thread_state_() == TERMINATING &&
            num_currently_waiting_requests == 0)
            break;

        std::unique_lock<std::mutex> lock(waiting_mtx_);
        if (TLX_UNLIKELY(waiting_requests_.empty())) {
            // unlock queue
            lock.unlock();

            // num_waiting_requests_-- was premature, compensate for that
            num_waiting_requests_.signal();
            continue;
        }

        // collect requests from waiting queue: first is there
        std::vector<request_ptr> reqs;

        request_ptr req = waiting_requests_.front();
        waiting_requests_.pop_front();
        reqs.emplace_back(std::move(req));

        // collect additional requests
        while (!waiting_requests_.empty()) {
            // acquire one free event, but keep one in slack
            if (!num_free_events_.try_acquire(/* delta */ 1, /* slack */ 1))
                break;
            if (!num_waiting_requests_.try_acquire()) {
                num_free_events_.signal();
                break;
            }

            request_ptr req = waiting_requests_.front();
            waiting_requests_.pop_front();
            reqs.emplace_back(std::move(req));
        }

        lock.unlock();

        // the last free_event must be acquired outside of the lock.
        num_free_events_.wait();

        // construct batch iocb
        tlx::simple_vector<iocb*> cbs(reqs.size());

        for (size_t i = 0; i < reqs.size(); ++i) {
            // polymorphic_downcast
            auto ar = dynamic_cast<linuxaio_request*>(reqs[i].get());
            cbs[i] = ar->fill_control_block();
        }
        reqs.clear();

        // io_submit loop
        size_t cb_done = 0;
        while (cb_done < cbs.size()) {
            long success = syscall(
                    SYS_io_submit, context_,
                    cbs.size() - cb_done,
                    cbs.data() + cb_done
                );

            if (success <= 0 && errno != EAGAIN) {
                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_request::post io_submit()"
                );
            }
            if (success > 0) {
                // request is posted
                num_posted_requests_.signal(success);

                cb_done += success;
                if (cb_done == cbs.size())
                    break;
            }

            // post failed, so first handle events to make queues (more) empty,
            // then try again.

            // wait for at least one event to complete, no time limit
            long num_events = syscall(
                    SYS_io_getevents, context_, 0,
                    max_events_, events.data(), nullptr
                );
            if (num_events < 0) {
                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_queue::post_requests"
                    " io_getevents() nr_events=" << num_events
                );
            }
            if (num_events > 0)
                handle_events(events.data(), num_events, false);
        }
    }
}